

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsMetaDataDestroy(FmsMetaData *mdata)

{
  void *__ptr;
  int new_err;
  undefined8 *in_RDI;
  FmsMetaData md;
  int err;
  undefined4 local_14;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_14 = 0;
  if (in_RDI == (undefined8 *)0x0) {
    local_14 = 1;
  }
  else {
    __ptr = (void *)*in_RDI;
    if (__ptr != (void *)0x0) {
      new_err = FmsMetaDataClear((FmsMetaData)
                                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      local_14 = UpdateError(0,new_err);
      free(__ptr);
      *in_RDI = 0;
    }
  }
  return local_14;
}

Assistant:

int FmsMetaDataDestroy(FmsMetaData *mdata) {
  int err = 0;
  if (!mdata) { E_RETURN(1); }
  FmsMetaData md = *mdata;
  if (md) {
    err = UpdateError(err, FmsMetaDataClear(md));
    free(md);
    *mdata = NULL;
  }
  E_RETURN(err);
}